

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

char * Wlc_PrsFindWord(char *pStr,char *pWord,int *fFound)

{
  int iVar1;
  size_t sVar2;
  int *fFound_local;
  char *pWord_local;
  char *pStr_local;
  
  *fFound = 0;
  pStr_local = Wlc_PrsSkipSpaces(pStr);
  iVar1 = Wlc_PrsStrCmp(pStr_local,pWord);
  if (iVar1 != 0) {
    *fFound = 1;
    sVar2 = strlen(pWord);
    pStr_local = pStr_local + sVar2;
  }
  return pStr_local;
}

Assistant:

static inline char * Wlc_PrsFindWord( char * pStr, char * pWord, int * fFound )
{
    *fFound = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( !Wlc_PrsStrCmp(pStr, pWord) )
        return pStr;
    *fFound = 1;
    return pStr + strlen(pWord);
}